

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O1

REF_STATUS ref_fixture_pri_stack_grid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi)

{
  int iVar1;
  REF_GRID_conflict pRVar2;
  REF_NODE ref_node;
  REF_DBL *pRVar3;
  REF_DBL *pRVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  REF_INT RVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  REF_INT cell;
  REF_INT local [27];
  REF_INT local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  REF_INT local_98;
  int local_94 [25];
  
  uVar6 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x303
           ,"ref_fixture_pri_stack_grid",(ulong)uVar6,"create");
    return uVar6;
  }
  pRVar2 = *ref_grid_ptr;
  ref_node = pRVar2->node;
  iVar1 = ref_mpi->id;
  lVar12 = (long)ref_mpi->n;
  iVar10 = 0;
  lVar8 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xb)) / SEXT816(lVar12),0);
  lVar11 = lVar8 * lVar12;
  if (0xb < lVar11) {
    iVar10 = ((int)((((lVar12 + 0xb) / lVar12) * (lVar11 + -0xc)) / lVar8) - (int)lVar11) + 0xc;
  }
  if (iVar1 == iVar10) {
LAB_00120e33:
    uVar6 = ref_node_add(ref_node,0,&local_a8);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x319,"ref_fixture_pri_stack_grid",(ulong)uVar6,"add node");
      return uVar6;
    }
    pRVar3 = ref_node->real;
    lVar12 = (long)local_a8;
    pRVar4 = pRVar3 + lVar12 * 0xf;
    *pRVar4 = 0.0;
    pRVar4[1] = 0.0;
    pRVar3[lVar12 * 0xf + 2] = 0.0;
    lVar8 = -1;
    if (((-1 < lVar12) && (local_a8 < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar8 = ref_node->global[lVar12];
    }
    lVar13 = (long)ref_mpi->n;
    lVar11 = (lVar13 + 0xb) / lVar13;
    auVar5 = ZEXT816(0) << 0x40 | ZEXT816(0xb);
    lVar9 = SUB168(auVar5 / SEXT816(lVar13),0);
    if (SUB168(auVar5 % SEXT816(lVar13),0) < lVar8 / lVar11) {
      lVar8 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      lVar13 = 0xc - lVar9 * lVar13;
      RVar7 = (int)((lVar8 - lVar11 * lVar13) / lVar9) + (int)lVar13;
    }
    else {
      lVar8 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      RVar7 = (REF_INT)(lVar8 / lVar11);
    }
    ref_node->part[lVar12] = RVar7;
    uVar6 = ref_node_add(ref_node,1,&local_a4);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x31a,"ref_fixture_pri_stack_grid",(ulong)uVar6,"add node");
      return uVar6;
    }
    pRVar4 = ref_node->real;
    lVar12 = (long)local_a4;
    pRVar4[lVar12 * 0xf] = 1.0;
    pRVar4 = pRVar4 + lVar12 * 0xf + 1;
    *pRVar4 = 0.0;
    pRVar4[1] = 0.0;
    lVar8 = -1;
    if (((-1 < lVar12) && (local_a4 < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar8 = ref_node->global[lVar12];
    }
    lVar13 = (long)ref_mpi->n;
    lVar11 = (lVar13 + 0xb) / lVar13;
    auVar5 = ZEXT816(0) << 0x40 | ZEXT816(0xb);
    lVar9 = SUB168(auVar5 / SEXT816(lVar13),0);
    if (SUB168(auVar5 % SEXT816(lVar13),0) < lVar8 / lVar11) {
      lVar8 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      lVar13 = 0xc - lVar9 * lVar13;
      RVar7 = (int)((lVar8 - lVar11 * lVar13) / lVar9) + (int)lVar13;
    }
    else {
      lVar8 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      RVar7 = (REF_INT)(lVar8 / lVar11);
    }
    ref_node->part[lVar12] = RVar7;
    uVar6 = ref_node_add(ref_node,2,&local_a0);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x31b,"ref_fixture_pri_stack_grid",(ulong)uVar6,"add node");
      return uVar6;
    }
    pRVar4 = ref_node->real;
    lVar12 = (long)local_a0;
    pRVar4[lVar12 * 0xf] = 0.0;
    pRVar4[lVar12 * 0xf + 1] = 1.0;
    pRVar4[lVar12 * 0xf + 2] = 0.0;
    lVar8 = -1;
    if (((-1 < lVar12) && (local_a0 < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar8 = ref_node->global[lVar12];
    }
    lVar13 = (long)ref_mpi->n;
    lVar11 = (lVar13 + 0xb) / lVar13;
    auVar5 = ZEXT816(0) << 0x40 | ZEXT816(0xb);
    lVar9 = SUB168(auVar5 / SEXT816(lVar13),0);
    if (SUB168(auVar5 % SEXT816(lVar13),0) < lVar8 / lVar11) {
      lVar8 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      lVar13 = 0xc - lVar9 * lVar13;
      RVar7 = (int)((lVar8 - lVar11 * lVar13) / lVar9) + (int)lVar13;
    }
    else {
      lVar8 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      RVar7 = (REF_INT)(lVar8 / lVar11);
    }
    ref_node->part[lVar12] = RVar7;
    uVar6 = ref_node_add(ref_node,3,&local_9c);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x31c,"ref_fixture_pri_stack_grid",(ulong)uVar6,"add node");
      return uVar6;
    }
    pRVar3 = ref_node->real;
    lVar12 = (long)local_9c;
    pRVar4 = pRVar3 + lVar12 * 0xf;
    *pRVar4 = 0.0;
    pRVar4[1] = 0.0;
    pRVar3[lVar12 * 0xf + 2] = 1.0;
    lVar8 = -1;
    if (((-1 < lVar12) && (local_9c < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar8 = ref_node->global[lVar12];
    }
    lVar13 = (long)ref_mpi->n;
    lVar11 = (lVar13 + 0xb) / lVar13;
    auVar5 = ZEXT816(0) << 0x40 | ZEXT816(0xb);
    lVar9 = SUB168(auVar5 / SEXT816(lVar13),0);
    if (SUB168(auVar5 % SEXT816(lVar13),0) < lVar8 / lVar11) {
      lVar8 = -1;
      if ((-1 < local_9c) && (local_9c < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      lVar13 = 0xc - lVar9 * lVar13;
      RVar7 = (int)((lVar8 - lVar11 * lVar13) / lVar9) + (int)lVar13;
    }
    else {
      lVar8 = -1;
      if ((-1 < local_9c) && (local_9c < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      RVar7 = (REF_INT)(lVar8 / lVar11);
    }
    ref_node->part[lVar12] = RVar7;
    uVar6 = ref_node_add(ref_node,4,&local_98);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x31d,"ref_fixture_pri_stack_grid",(ulong)uVar6,"add node");
      return uVar6;
    }
    pRVar4 = ref_node->real;
    lVar12 = (long)local_98;
    pRVar4[lVar12 * 0xf] = 1.0;
    pRVar4[lVar12 * 0xf + 1] = 0.0;
    pRVar4[lVar12 * 0xf + 2] = 1.0;
    lVar8 = -1;
    if (((-1 < lVar12) && (local_98 < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar8 = ref_node->global[lVar12];
    }
    lVar13 = (long)ref_mpi->n;
    lVar11 = (lVar13 + 0xb) / lVar13;
    auVar5 = ZEXT816(0) << 0x40 | ZEXT816(0xb);
    lVar9 = SUB168(auVar5 / SEXT816(lVar13),0);
    if (SUB168(auVar5 % SEXT816(lVar13),0) < lVar8 / lVar11) {
      lVar8 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      lVar13 = 0xc - lVar9 * lVar13;
      RVar7 = (int)((lVar8 - lVar11 * lVar13) / lVar9) + (int)lVar13;
    }
    else {
      lVar8 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      RVar7 = (REF_INT)(lVar8 / lVar11);
    }
    ref_node->part[lVar12] = RVar7;
    uVar6 = ref_node_add(ref_node,5,local_94);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x31e,"ref_fixture_pri_stack_grid",(ulong)uVar6,"add node");
      return uVar6;
    }
    pRVar4 = ref_node->real;
    lVar12 = (long)local_94[0];
    pRVar4[lVar12 * 0xf] = 0.0;
    pRVar4[lVar12 * 0xf + 1] = 1.0;
    pRVar4[lVar12 * 0xf + 2] = 1.0;
    lVar8 = -1;
    if (((-1 < lVar12) && (local_94[0] < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar8 = ref_node->global[lVar12];
    }
    lVar13 = (long)ref_mpi->n;
    lVar11 = (lVar13 + 0xb) / lVar13;
    auVar5 = ZEXT816(0) << 0x40 | ZEXT816(0xb);
    lVar9 = SUB168(auVar5 / SEXT816(lVar13),0);
    if (SUB168(auVar5 % SEXT816(lVar13),0) < lVar8 / lVar11) {
      lVar8 = -1;
      if ((-1 < local_94[0]) && (local_94[0] < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      lVar13 = 0xc - lVar9 * lVar13;
      RVar7 = (int)((lVar8 - lVar11 * lVar13) / lVar9) + (int)lVar13;
    }
    else {
      lVar8 = -1;
      if ((-1 < local_94[0]) && (local_94[0] < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      RVar7 = (REF_INT)(lVar8 / lVar11);
    }
    ref_node->part[lVar12] = RVar7;
    uVar6 = ref_cell_add(pRVar2->cell[10],&local_a8,&local_ac);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",800
             ,"ref_fixture_pri_stack_grid",(ulong)uVar6,"add prism");
      return uVar6;
    }
  }
  else {
    lVar12 = (lVar12 + 0xb) / lVar12;
    lVar9 = 0;
    if (lVar12 + 1U < 3) {
      lVar9 = lVar12;
    }
    lVar11 = 0xc - lVar11;
    if (lVar11 <= lVar9) {
      lVar9 = (1 - lVar12 * lVar11) / lVar8 + lVar11;
    }
    if (iVar1 == (int)lVar9) goto LAB_00120e33;
    lVar9 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2)) / SEXT816(lVar12),0);
    if (lVar11 <= lVar9) {
      lVar9 = (2 - lVar12 * lVar11) / lVar8 + lVar11;
    }
    if (iVar1 == (int)lVar9) goto LAB_00120e33;
    lVar9 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) / SEXT816(lVar12),0);
    if (lVar11 <= lVar9) {
      lVar9 = (3 - lVar12 * lVar11) / lVar8 + lVar11;
    }
    if (iVar1 == (int)lVar9) goto LAB_00120e33;
    lVar9 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) / SEXT816(lVar12),0);
    if (lVar11 <= lVar9) {
      lVar9 = (4 - lVar12 * lVar11) / lVar8 + lVar11;
    }
    if (iVar1 == (int)lVar9) goto LAB_00120e33;
    lVar9 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(5)) / SEXT816(lVar12),0);
    if (lVar11 <= lVar9) {
      lVar9 = (5 - lVar12 * lVar11) / lVar8 + lVar11;
    }
    if (iVar1 == (int)lVar9) goto LAB_00120e33;
  }
  iVar1 = ref_mpi->id;
  lVar9 = (long)ref_mpi->n;
  lVar8 = (lVar9 + 0xb) / lVar9;
  lVar12 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) / SEXT816(lVar8),0);
  lVar11 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xb)) / SEXT816(lVar9),0);
  lVar9 = 0xc - lVar11 * lVar9;
  if (lVar9 <= lVar12) {
    lVar12 = (3 - lVar9 * lVar8) / lVar11 + lVar9;
  }
  if (iVar1 == (int)lVar12) {
LAB_00121726:
    uVar6 = ref_node_add(ref_node,3,&local_a8);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x335,"ref_fixture_pri_stack_grid",(ulong)uVar6,"add node");
      return uVar6;
    }
    pRVar3 = ref_node->real;
    lVar12 = (long)local_a8;
    pRVar4 = pRVar3 + lVar12 * 0xf;
    *pRVar4 = 0.0;
    pRVar4[1] = 0.0;
    pRVar3[lVar12 * 0xf + 2] = 1.0;
    lVar8 = -1;
    if (((-1 < lVar12) && (local_a8 < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar8 = ref_node->global[lVar12];
    }
    lVar13 = (long)ref_mpi->n;
    lVar11 = (lVar13 + 0xb) / lVar13;
    auVar5 = ZEXT816(0) << 0x40 | ZEXT816(0xb);
    lVar9 = SUB168(auVar5 / SEXT816(lVar13),0);
    if (SUB168(auVar5 % SEXT816(lVar13),0) < lVar8 / lVar11) {
      lVar8 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      lVar13 = 0xc - lVar9 * lVar13;
      RVar7 = (int)((lVar8 - lVar11 * lVar13) / lVar9) + (int)lVar13;
    }
    else {
      lVar8 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      RVar7 = (REF_INT)(lVar8 / lVar11);
    }
    ref_node->part[lVar12] = RVar7;
    uVar6 = ref_node_add(ref_node,4,&local_a4);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x336,"ref_fixture_pri_stack_grid",(ulong)uVar6,"add node");
      return uVar6;
    }
    pRVar4 = ref_node->real;
    lVar12 = (long)local_a4;
    pRVar4[lVar12 * 0xf] = 1.0;
    pRVar4[lVar12 * 0xf + 1] = 0.0;
    pRVar4[lVar12 * 0xf + 2] = 1.0;
    lVar8 = -1;
    if (((-1 < lVar12) && (local_a4 < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar8 = ref_node->global[lVar12];
    }
    lVar13 = (long)ref_mpi->n;
    lVar11 = (lVar13 + 0xb) / lVar13;
    auVar5 = ZEXT816(0) << 0x40 | ZEXT816(0xb);
    lVar9 = SUB168(auVar5 / SEXT816(lVar13),0);
    if (SUB168(auVar5 % SEXT816(lVar13),0) < lVar8 / lVar11) {
      lVar8 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      lVar13 = 0xc - lVar9 * lVar13;
      RVar7 = (int)((lVar8 - lVar11 * lVar13) / lVar9) + (int)lVar13;
    }
    else {
      lVar8 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      RVar7 = (REF_INT)(lVar8 / lVar11);
    }
    ref_node->part[lVar12] = RVar7;
    uVar6 = ref_node_add(ref_node,5,&local_a0);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x337,"ref_fixture_pri_stack_grid",(ulong)uVar6,"add node");
      return uVar6;
    }
    pRVar4 = ref_node->real;
    lVar12 = (long)local_a0;
    pRVar4[lVar12 * 0xf] = 0.0;
    pRVar4[lVar12 * 0xf + 1] = 1.0;
    pRVar4[lVar12 * 0xf + 2] = 1.0;
    lVar8 = -1;
    if (((-1 < lVar12) && (local_a0 < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar8 = ref_node->global[lVar12];
    }
    lVar13 = (long)ref_mpi->n;
    lVar11 = (lVar13 + 0xb) / lVar13;
    auVar5 = ZEXT816(0) << 0x40 | ZEXT816(0xb);
    lVar9 = SUB168(auVar5 / SEXT816(lVar13),0);
    if (SUB168(auVar5 % SEXT816(lVar13),0) < lVar8 / lVar11) {
      lVar8 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      lVar13 = 0xc - lVar9 * lVar13;
      RVar7 = (int)((lVar8 - lVar11 * lVar13) / lVar9) + (int)lVar13;
    }
    else {
      lVar8 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      RVar7 = (REF_INT)(lVar8 / lVar11);
    }
    ref_node->part[lVar12] = RVar7;
    uVar6 = ref_node_add(ref_node,6,&local_9c);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x338,"ref_fixture_pri_stack_grid",(ulong)uVar6,"add node");
      return uVar6;
    }
    pRVar3 = ref_node->real;
    lVar12 = (long)local_9c;
    pRVar4 = pRVar3 + lVar12 * 0xf;
    *pRVar4 = 0.0;
    pRVar4[1] = 0.0;
    pRVar3[lVar12 * 0xf + 2] = 2.0;
    lVar8 = -1;
    if (((-1 < lVar12) && (local_9c < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar8 = ref_node->global[lVar12];
    }
    lVar13 = (long)ref_mpi->n;
    lVar11 = (lVar13 + 0xb) / lVar13;
    auVar5 = ZEXT816(0) << 0x40 | ZEXT816(0xb);
    lVar9 = SUB168(auVar5 / SEXT816(lVar13),0);
    if (SUB168(auVar5 % SEXT816(lVar13),0) < lVar8 / lVar11) {
      lVar8 = -1;
      if ((-1 < local_9c) && (local_9c < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      lVar13 = 0xc - lVar9 * lVar13;
      RVar7 = (int)((lVar8 - lVar11 * lVar13) / lVar9) + (int)lVar13;
    }
    else {
      lVar8 = -1;
      if ((-1 < local_9c) && (local_9c < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      RVar7 = (REF_INT)(lVar8 / lVar11);
    }
    ref_node->part[lVar12] = RVar7;
    uVar6 = ref_node_add(ref_node,7,&local_98);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x339,"ref_fixture_pri_stack_grid",(ulong)uVar6,"add node");
      return uVar6;
    }
    pRVar4 = ref_node->real;
    lVar12 = (long)local_98;
    pRVar4[lVar12 * 0xf] = 1.0;
    pRVar4[lVar12 * 0xf + 1] = 0.0;
    pRVar4[lVar12 * 0xf + 2] = 2.0;
    lVar8 = -1;
    if (((-1 < lVar12) && (local_98 < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar8 = ref_node->global[lVar12];
    }
    lVar13 = (long)ref_mpi->n;
    lVar11 = (lVar13 + 0xb) / lVar13;
    auVar5 = ZEXT816(0) << 0x40 | ZEXT816(0xb);
    lVar9 = SUB168(auVar5 / SEXT816(lVar13),0);
    if (SUB168(auVar5 % SEXT816(lVar13),0) < lVar8 / lVar11) {
      lVar8 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      lVar13 = 0xc - lVar9 * lVar13;
      RVar7 = (int)((lVar8 - lVar11 * lVar13) / lVar9) + (int)lVar13;
    }
    else {
      lVar8 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      RVar7 = (REF_INT)(lVar8 / lVar11);
    }
    ref_node->part[lVar12] = RVar7;
    uVar6 = ref_node_add(ref_node,8,local_94);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x33a,"ref_fixture_pri_stack_grid",(ulong)uVar6,"add node");
      return uVar6;
    }
    pRVar4 = ref_node->real;
    lVar12 = (long)local_94[0];
    pRVar4[lVar12 * 0xf] = 0.0;
    pRVar4[lVar12 * 0xf + 1] = 1.0;
    pRVar4[lVar12 * 0xf + 2] = 2.0;
    lVar8 = -1;
    if (((-1 < lVar12) && (local_94[0] < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar8 = ref_node->global[lVar12];
    }
    lVar13 = (long)ref_mpi->n;
    lVar11 = (lVar13 + 0xb) / lVar13;
    auVar5 = ZEXT816(0) << 0x40 | ZEXT816(0xb);
    lVar9 = SUB168(auVar5 / SEXT816(lVar13),0);
    if (SUB168(auVar5 % SEXT816(lVar13),0) < lVar8 / lVar11) {
      lVar8 = -1;
      if ((-1 < local_94[0]) && (local_94[0] < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      lVar13 = 0xc - lVar9 * lVar13;
      RVar7 = (int)((lVar8 - lVar11 * lVar13) / lVar9) + (int)lVar13;
    }
    else {
      lVar8 = -1;
      if ((-1 < local_94[0]) && (local_94[0] < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      RVar7 = (REF_INT)(lVar8 / lVar11);
    }
    ref_node->part[lVar12] = RVar7;
    uVar6 = ref_cell_add(pRVar2->cell[10],&local_a8,&local_ac);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x33c,"ref_fixture_pri_stack_grid",(ulong)uVar6,"add prism");
      return uVar6;
    }
  }
  else {
    lVar12 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) / SEXT816(lVar8),0);
    if (lVar9 <= lVar12) {
      lVar12 = (4 - lVar9 * lVar8) / lVar11 + lVar9;
    }
    if (iVar1 == (int)lVar12) goto LAB_00121726;
    lVar12 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(5)) / SEXT816(lVar8),0);
    if (lVar9 <= lVar12) {
      lVar12 = (5 - lVar9 * lVar8) / lVar11 + lVar9;
    }
    if (iVar1 == (int)lVar12) goto LAB_00121726;
    lVar12 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6)) / SEXT816(lVar8),0);
    if (lVar9 <= lVar12) {
      lVar12 = (6 - lVar9 * lVar8) / lVar11 + lVar9;
    }
    if (iVar1 == (int)lVar12) goto LAB_00121726;
    lVar12 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(7)) / SEXT816(lVar8),0);
    if (lVar9 <= lVar12) {
      lVar12 = (7 - lVar9 * lVar8) / lVar11 + lVar9;
    }
    if (iVar1 == (int)lVar12) goto LAB_00121726;
    lVar12 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(8)) / SEXT816(lVar8),0);
    if (lVar9 <= lVar12) {
      lVar12 = (8 - lVar8 * lVar9) / lVar11 + lVar9;
    }
    if (iVar1 == (int)lVar12) goto LAB_00121726;
  }
  iVar1 = ref_mpi->id;
  lVar9 = (long)ref_mpi->n;
  lVar8 = (lVar9 + 0xb) / lVar9;
  lVar12 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6)) / SEXT816(lVar8),0);
  lVar11 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xb)) / SEXT816(lVar9),0);
  lVar9 = 0xc - lVar11 * lVar9;
  if (lVar9 <= lVar12) {
    lVar12 = (6 - lVar9 * lVar8) / lVar11 + lVar9;
  }
  if (iVar1 == (int)lVar12) {
LAB_0012203e:
    uVar6 = ref_node_add(ref_node,6,&local_a8);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x351,"ref_fixture_pri_stack_grid",(ulong)uVar6,"add node");
      return uVar6;
    }
    pRVar3 = ref_node->real;
    lVar12 = (long)local_a8;
    pRVar4 = pRVar3 + lVar12 * 0xf;
    *pRVar4 = 0.0;
    pRVar4[1] = 0.0;
    pRVar3[lVar12 * 0xf + 2] = 2.0;
    lVar8 = -1;
    if (((-1 < lVar12) && (local_a8 < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar8 = ref_node->global[lVar12];
    }
    lVar13 = (long)ref_mpi->n;
    lVar11 = (lVar13 + 0xb) / lVar13;
    auVar5 = ZEXT816(0) << 0x40 | ZEXT816(0xb);
    lVar9 = SUB168(auVar5 / SEXT816(lVar13),0);
    if (SUB168(auVar5 % SEXT816(lVar13),0) < lVar8 / lVar11) {
      lVar8 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      lVar13 = 0xc - lVar9 * lVar13;
      RVar7 = (int)((lVar8 - lVar11 * lVar13) / lVar9) + (int)lVar13;
    }
    else {
      lVar8 = -1;
      if ((-1 < local_a8) && (local_a8 < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      RVar7 = (REF_INT)(lVar8 / lVar11);
    }
    ref_node->part[lVar12] = RVar7;
    uVar6 = ref_node_add(ref_node,7,&local_a4);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x352,"ref_fixture_pri_stack_grid",(ulong)uVar6,"add node");
      return uVar6;
    }
    pRVar4 = ref_node->real;
    lVar12 = (long)local_a4;
    pRVar4[lVar12 * 0xf] = 1.0;
    pRVar4[lVar12 * 0xf + 1] = 0.0;
    pRVar4[lVar12 * 0xf + 2] = 2.0;
    lVar8 = -1;
    if (((-1 < lVar12) && (local_a4 < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar8 = ref_node->global[lVar12];
    }
    lVar13 = (long)ref_mpi->n;
    lVar11 = (lVar13 + 0xb) / lVar13;
    auVar5 = ZEXT816(0) << 0x40 | ZEXT816(0xb);
    lVar9 = SUB168(auVar5 / SEXT816(lVar13),0);
    if (SUB168(auVar5 % SEXT816(lVar13),0) < lVar8 / lVar11) {
      lVar8 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      lVar13 = 0xc - lVar9 * lVar13;
      RVar7 = (int)((lVar8 - lVar11 * lVar13) / lVar9) + (int)lVar13;
    }
    else {
      lVar8 = -1;
      if ((-1 < local_a4) && (local_a4 < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      RVar7 = (REF_INT)(lVar8 / lVar11);
    }
    ref_node->part[lVar12] = RVar7;
    uVar6 = ref_node_add(ref_node,8,&local_a0);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x353,"ref_fixture_pri_stack_grid",(ulong)uVar6,"add node");
      return uVar6;
    }
    pRVar4 = ref_node->real;
    lVar12 = (long)local_a0;
    pRVar4[lVar12 * 0xf] = 0.0;
    pRVar4[lVar12 * 0xf + 1] = 1.0;
    pRVar4[lVar12 * 0xf + 2] = 2.0;
    lVar8 = -1;
    if (((-1 < lVar12) && (local_a0 < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar8 = ref_node->global[lVar12];
    }
    lVar13 = (long)ref_mpi->n;
    lVar11 = (lVar13 + 0xb) / lVar13;
    auVar5 = ZEXT816(0) << 0x40 | ZEXT816(0xb);
    lVar9 = SUB168(auVar5 / SEXT816(lVar13),0);
    if (SUB168(auVar5 % SEXT816(lVar13),0) < lVar8 / lVar11) {
      lVar8 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      lVar13 = 0xc - lVar9 * lVar13;
      RVar7 = (int)((lVar8 - lVar11 * lVar13) / lVar9) + (int)lVar13;
    }
    else {
      lVar8 = -1;
      if ((-1 < local_a0) && (local_a0 < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      RVar7 = (REF_INT)(lVar8 / lVar11);
    }
    ref_node->part[lVar12] = RVar7;
    uVar6 = ref_node_add(ref_node,9,&local_9c);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x354,"ref_fixture_pri_stack_grid",(ulong)uVar6,"add node");
      return uVar6;
    }
    pRVar3 = ref_node->real;
    lVar12 = (long)local_9c;
    pRVar4 = pRVar3 + lVar12 * 0xf;
    *pRVar4 = 0.0;
    pRVar4[1] = 0.0;
    pRVar3[lVar12 * 0xf + 2] = 3.0;
    lVar8 = -1;
    if (((-1 < lVar12) && (local_9c < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar8 = ref_node->global[lVar12];
    }
    lVar13 = (long)ref_mpi->n;
    lVar11 = (lVar13 + 0xb) / lVar13;
    auVar5 = ZEXT816(0) << 0x40 | ZEXT816(0xb);
    lVar9 = SUB168(auVar5 / SEXT816(lVar13),0);
    if (SUB168(auVar5 % SEXT816(lVar13),0) < lVar8 / lVar11) {
      lVar8 = -1;
      if ((-1 < local_9c) && (local_9c < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      lVar13 = 0xc - lVar9 * lVar13;
      RVar7 = (int)((lVar8 - lVar11 * lVar13) / lVar9) + (int)lVar13;
    }
    else {
      lVar8 = -1;
      if ((-1 < local_9c) && (local_9c < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      RVar7 = (REF_INT)(lVar8 / lVar11);
    }
    ref_node->part[lVar12] = RVar7;
    uVar6 = ref_node_add(ref_node,10,&local_98);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x355,"ref_fixture_pri_stack_grid",(ulong)uVar6,"add node");
      return uVar6;
    }
    pRVar4 = ref_node->real;
    lVar12 = (long)local_98;
    pRVar4[lVar12 * 0xf] = 1.0;
    pRVar4[lVar12 * 0xf + 1] = 0.0;
    pRVar4[lVar12 * 0xf + 2] = 3.0;
    lVar8 = -1;
    if (((-1 < lVar12) && (local_98 < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar8 = ref_node->global[lVar12];
    }
    lVar13 = (long)ref_mpi->n;
    lVar11 = (lVar13 + 0xb) / lVar13;
    auVar5 = ZEXT816(0) << 0x40 | ZEXT816(0xb);
    lVar9 = SUB168(auVar5 / SEXT816(lVar13),0);
    if (SUB168(auVar5 % SEXT816(lVar13),0) < lVar8 / lVar11) {
      lVar8 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      lVar13 = 0xc - lVar9 * lVar13;
      RVar7 = (int)((lVar8 - lVar11 * lVar13) / lVar9) + (int)lVar13;
    }
    else {
      lVar8 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      RVar7 = (REF_INT)(lVar8 / lVar11);
    }
    ref_node->part[lVar12] = RVar7;
    uVar6 = ref_node_add(ref_node,0xb,local_94);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x356,"ref_fixture_pri_stack_grid",(ulong)uVar6,"add node");
      return uVar6;
    }
    pRVar4 = ref_node->real;
    lVar12 = (long)local_94[0];
    pRVar4[lVar12 * 0xf] = 0.0;
    pRVar4[lVar12 * 0xf + 1] = 1.0;
    pRVar4[lVar12 * 0xf + 2] = 3.0;
    lVar8 = -1;
    if (((-1 < lVar12) && (local_94[0] < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar8 = ref_node->global[lVar12];
    }
    lVar13 = (long)ref_mpi->n;
    lVar11 = (lVar13 + 0xb) / lVar13;
    auVar5 = ZEXT816(0) << 0x40 | ZEXT816(0xb);
    lVar9 = SUB168(auVar5 / SEXT816(lVar13),0);
    if (SUB168(auVar5 % SEXT816(lVar13),0) < lVar8 / lVar11) {
      lVar8 = -1;
      if ((-1 < local_94[0]) && (local_94[0] < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      lVar13 = 0xc - lVar9 * lVar13;
      RVar7 = (int)((lVar8 - lVar11 * lVar13) / lVar9) + (int)lVar13;
    }
    else {
      lVar8 = -1;
      if ((-1 < local_94[0]) && (local_94[0] < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      RVar7 = (REF_INT)(lVar8 / lVar11);
    }
    ref_node->part[lVar12] = RVar7;
    uVar6 = ref_cell_add(pRVar2->cell[10],&local_a8,&local_ac);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x358,"ref_fixture_pri_stack_grid",(ulong)uVar6,"add prism");
      return uVar6;
    }
  }
  else {
    lVar12 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(7)) / SEXT816(lVar8),0);
    if (lVar9 <= lVar12) {
      lVar12 = (7 - lVar9 * lVar8) / lVar11 + lVar9;
    }
    if (iVar1 == (int)lVar12) goto LAB_0012203e;
    lVar12 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(8)) / SEXT816(lVar8),0);
    if (lVar9 <= lVar12) {
      lVar12 = (8 - lVar9 * lVar8) / lVar11 + lVar9;
    }
    if (iVar1 == (int)lVar12) goto LAB_0012203e;
    lVar12 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(9)) / SEXT816(lVar8),0);
    if (lVar9 <= lVar12) {
      lVar12 = (9 - lVar9 * lVar8) / lVar11 + lVar9;
    }
    if (iVar1 == (int)lVar12) goto LAB_0012203e;
    lVar12 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(10)) / SEXT816(lVar8),0);
    if (lVar9 <= lVar12) {
      lVar12 = (10 - lVar9 * lVar8) / lVar11 + lVar9;
    }
    if (iVar1 == (int)lVar12) goto LAB_0012203e;
    lVar12 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xb)) / SEXT816(lVar8),0);
    if (lVar9 <= lVar12) {
      lVar12 = (0xb - lVar8 * lVar9) / lVar11 + lVar9;
    }
    if (iVar1 == (int)lVar12) goto LAB_0012203e;
  }
  uVar6 = ref_node_initialize_n_global(ref_node,0xc);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x35b
           ,"ref_fixture_pri_stack_grid",(ulong)uVar6,"glob");
    return uVar6;
  }
  iVar1 = ref_mpi->id;
  lVar11 = (long)ref_mpi->n;
  lVar12 = (lVar11 + 0xb) / lVar11;
  lVar8 = 0;
  if (lVar12 + 1U < 3) {
    lVar8 = lVar12;
  }
  lVar9 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xb)) / SEXT816(lVar11),0);
  lVar11 = lVar9 * lVar11;
  lVar13 = 0xc - lVar11;
  if (lVar13 <= lVar8) {
    lVar8 = (1 - lVar13 * lVar12) / lVar9 + lVar13;
  }
  if (iVar1 == (int)lVar8) {
LAB_0012293f:
    uVar6 = ref_node_local(ref_node,1,&local_a8);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x36a,"ref_fixture_pri_stack_grid",(ulong)uVar6,"loc");
      return uVar6;
    }
    uVar6 = ref_node_local(ref_node,0,&local_a4);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x36b,"ref_fixture_pri_stack_grid",(ulong)uVar6,"loc");
      return uVar6;
    }
    uVar6 = ref_node_local(ref_node,3,&local_a0);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x36c,"ref_fixture_pri_stack_grid",(ulong)uVar6,"loc");
      return uVar6;
    }
    uVar6 = ref_node_local(ref_node,4,&local_9c);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x36d,"ref_fixture_pri_stack_grid",(ulong)uVar6,"loc");
      return uVar6;
    }
    local_98 = 0x14;
    uVar6 = ref_cell_add(pRVar2->cell[6],&local_a8,&local_ac);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x36f,"ref_fixture_pri_stack_grid",(ulong)uVar6,"add quad");
      return uVar6;
    }
  }
  else {
    iVar10 = 0;
    if (0xb < lVar11) {
      iVar10 = ((int)(((lVar11 + -0xc) * lVar12) / lVar9) - (int)lVar11) + 0xc;
    }
    if (iVar1 == iVar10) goto LAB_0012293f;
    lVar8 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) / SEXT816(lVar12),0);
    if (lVar13 <= lVar8) {
      lVar8 = (3 - lVar13 * lVar12) / lVar9 + lVar13;
    }
    if (iVar1 == (int)lVar8) goto LAB_0012293f;
    lVar8 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) / SEXT816(lVar12),0);
    if (lVar13 <= lVar8) {
      lVar8 = (4 - lVar12 * lVar13) / lVar9 + lVar13;
    }
    if (iVar1 == (int)lVar8) goto LAB_0012293f;
  }
  iVar1 = ref_mpi->id;
  lVar9 = (long)ref_mpi->n;
  lVar8 = (lVar9 + 0xb) / lVar9;
  lVar12 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) / SEXT816(lVar8),0);
  lVar11 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xb)) / SEXT816(lVar9),0);
  lVar9 = 0xc - lVar11 * lVar9;
  if (lVar9 <= lVar12) {
    lVar12 = (4 - lVar9 * lVar8) / lVar11 + lVar9;
  }
  if (iVar1 != (int)lVar12) {
    lVar12 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) / SEXT816(lVar8),0);
    if (lVar9 <= lVar12) {
      lVar12 = (3 - lVar9 * lVar8) / lVar11 + lVar9;
    }
    if (iVar1 != (int)lVar12) {
      lVar12 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6)) / SEXT816(lVar8),0);
      if (lVar9 <= lVar12) {
        lVar12 = (6 - lVar9 * lVar8) / lVar11 + lVar9;
      }
      if (iVar1 != (int)lVar12) {
        lVar12 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(7)) / SEXT816(lVar8),0);
        if (lVar9 <= lVar12) {
          lVar12 = (7 - lVar8 * lVar9) / lVar11 + lVar9;
        }
        if (iVar1 != (int)lVar12) goto LAB_00122d5e;
      }
    }
  }
  uVar6 = ref_node_local(ref_node,4,&local_a8);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x37f
           ,"ref_fixture_pri_stack_grid",(ulong)uVar6,"loc");
    return uVar6;
  }
  uVar6 = ref_node_local(ref_node,3,&local_a4);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x380
           ,"ref_fixture_pri_stack_grid",(ulong)uVar6,"loc");
    return uVar6;
  }
  uVar6 = ref_node_local(ref_node,6,&local_a0);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x381
           ,"ref_fixture_pri_stack_grid",(ulong)uVar6,"loc");
    return uVar6;
  }
  uVar6 = ref_node_local(ref_node,7,&local_9c);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x382
           ,"ref_fixture_pri_stack_grid",(ulong)uVar6,"loc");
    return uVar6;
  }
  local_98 = 0x14;
  uVar6 = ref_cell_add(pRVar2->cell[6],&local_a8,&local_ac);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",900,
           "ref_fixture_pri_stack_grid",(ulong)uVar6,"add quad");
    return uVar6;
  }
LAB_00122d5e:
  iVar1 = ref_mpi->id;
  lVar9 = (long)ref_mpi->n;
  lVar8 = (lVar9 + 0xb) / lVar9;
  lVar12 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(7)) / SEXT816(lVar8),0);
  lVar11 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xb)) / SEXT816(lVar9),0);
  lVar9 = 0xc - lVar11 * lVar9;
  if (lVar9 <= lVar12) {
    lVar12 = (7 - lVar9 * lVar8) / lVar11 + lVar9;
  }
  if (iVar1 != (int)lVar12) {
    lVar12 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6)) / SEXT816(lVar8),0);
    if (lVar9 <= lVar12) {
      lVar12 = (6 - lVar9 * lVar8) / lVar11 + lVar9;
    }
    if (iVar1 != (int)lVar12) {
      lVar12 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(9)) / SEXT816(lVar8),0);
      if (lVar9 <= lVar12) {
        lVar12 = (9 - lVar9 * lVar8) / lVar11 + lVar9;
      }
      if (iVar1 != (int)lVar12) {
        lVar12 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(10)) / SEXT816(lVar8),0);
        if (lVar9 <= lVar12) {
          lVar12 = (10 - lVar8 * lVar9) / lVar11 + lVar9;
        }
        if (iVar1 != (int)lVar12) {
          return 0;
        }
      }
    }
  }
  uVar6 = ref_node_local(ref_node,7,&local_a8);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x394
           ,"ref_fixture_pri_stack_grid",(ulong)uVar6,"loc");
    return uVar6;
  }
  uVar6 = ref_node_local(ref_node,6,&local_a4);
  if (uVar6 == 0) {
    uVar6 = ref_node_local(ref_node,9,&local_a0);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x396,"ref_fixture_pri_stack_grid",(ulong)uVar6,"loc");
      return uVar6;
    }
    uVar6 = ref_node_local(ref_node,10,&local_9c);
    if (uVar6 == 0) {
      local_98 = 0x14;
      uVar6 = ref_cell_add(pRVar2->cell[6],&local_a8,&local_ac);
      if (uVar6 == 0) {
        return 0;
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x399,"ref_fixture_pri_stack_grid",(ulong)uVar6,"add quad");
      return uVar6;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x397
           ,"ref_fixture_pri_stack_grid",(ulong)uVar6,"loc");
    return uVar6;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x395,
         "ref_fixture_pri_stack_grid",(ulong)uVar6,"loc");
  return uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_pri_stack_grid(REF_GRID *ref_grid_ptr,
                                              REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_GLOB global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  REF_GLOB nnodesg = 12;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 3;
  global[4] = 4;
  global[5] = 5;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[4]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[5])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 1.0, 0.0, 0.0);
    add_that_node(2, 0.0, 1.0, 0.0);
    add_that_node(3, 0.0, 0.0, 1.0);
    add_that_node(4, 1.0, 0.0, 1.0);
    add_that_node(5, 0.0, 1.0, 1.0);

    RSS(ref_cell_add(ref_grid_pri(ref_grid), local, &cell), "add prism");
  }

  global[0] = 3;
  global[1] = 4;
  global[2] = 5;
  global[3] = 6;
  global[4] = 7;
  global[5] = 8;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[4]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[5])) {
    add_that_node(0, 0.0, 0.0, 1.0);
    add_that_node(1, 1.0, 0.0, 1.0);
    add_that_node(2, 0.0, 1.0, 1.0);
    add_that_node(3, 0.0, 0.0, 2.0);
    add_that_node(4, 1.0, 0.0, 2.0);
    add_that_node(5, 0.0, 1.0, 2.0);

    RSS(ref_cell_add(ref_grid_pri(ref_grid), local, &cell), "add prism");
  }

  global[0] = 6;
  global[1] = 7;
  global[2] = 8;
  global[3] = 9;
  global[4] = 10;
  global[5] = 11;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[4]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[5])) {
    add_that_node(0, 0.0, 0.0, 2.0);
    add_that_node(1, 1.0, 0.0, 2.0);
    add_that_node(2, 0.0, 1.0, 2.0);
    add_that_node(3, 0.0, 0.0, 3.0);
    add_that_node(4, 1.0, 0.0, 3.0);
    add_that_node(5, 0.0, 1.0, 3.0);

    RSS(ref_cell_add(ref_grid_pri(ref_grid), local, &cell), "add prism");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "glob");

  global[0] = 1;
  global[1] = 0;
  global[2] = 3;
  global[3] = 4;
  global[4] = 20;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    RSS(ref_node_local(ref_node, global[2], &(local[2])), "loc");
    RSS(ref_node_local(ref_node, global[3], &(local[3])), "loc");
    local[4] = (REF_INT)global[4];
    RSS(ref_cell_add(ref_grid_qua(ref_grid), local, &cell), "add quad");
  }

  global[0] = 4;
  global[1] = 3;
  global[2] = 6;
  global[3] = 7;
  global[4] = 20;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    RSS(ref_node_local(ref_node, global[2], &(local[2])), "loc");
    RSS(ref_node_local(ref_node, global[3], &(local[3])), "loc");
    local[4] = (REF_INT)global[4];
    RSS(ref_cell_add(ref_grid_qua(ref_grid), local, &cell), "add quad");
  }

  global[0] = 7;
  global[1] = 6;
  global[2] = 9;
  global[3] = 10;
  global[4] = 20;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    RSS(ref_node_local(ref_node, global[2], &(local[2])), "loc");
    RSS(ref_node_local(ref_node, global[3], &(local[3])), "loc");
    local[4] = (REF_INT)global[4];
    RSS(ref_cell_add(ref_grid_qua(ref_grid), local, &cell), "add quad");
  }

  return REF_SUCCESS;
}